

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

int __thiscall Grid::operator()(Grid *this,point p)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  
  bVar1 = cg_box::contains((this->box).ptr,p);
  if (bVar1) {
    piVar3 = cg_box::at((this->box).ptr,p);
    return *piVar3;
  }
  iVar2 = cg_other::operator()((this->other).ptr,p);
  return iVar2;
}

Assistant:

int Grid::operator()(point p) {
    if (box->contains(p)) {
        return box->at(p);
    }
    return (*other)(p);
}